

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

LockProxy __thiscall CategoriesMutex::try_lock(CategoriesMutex *this,int category)

{
  LockStatus LVar1;
  int in_EDX;
  CategoriesMutex *extraout_RDX;
  undefined4 in_register_00000034;
  CategoriesMutex *this_00;
  LockProxy LVar2;
  
  this_00 = (CategoriesMutex *)CONCAT44(in_register_00000034,category);
  std::mutex::lock(&this_00->internal_);
  LVar1 = try_lock_unsafe(this_00,in_EDX);
  this->current_category_ = LVar1;
  (this->category_sizes_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)this_00;
  pthread_mutex_unlock((pthread_mutex_t *)&this_00->internal_);
  LVar2.mutex_ = extraout_RDX;
  LVar2._0_8_ = this;
  return LVar2;
}

Assistant:

LockProxy try_lock(int category) {
        std::lock_guard lock(internal_);
        return LockProxy(*this, try_lock_unsafe(category));
    }